

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3648a::logical_combination_error_handler::error
          (logical_combination_error_handler *this,json_pointer *ptr,json *instance,string *message)

{
  pointer *ppeVar1;
  pointer __first;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  pointer __result;
  pointer peVar5;
  pointer peVar6;
  _Tp_alloc_type *__alloc;
  error_entry *__args;
  error_entry *__args_00;
  error_entry *extraout_RDX;
  ulong uVar7;
  undefined1 auStack_78 [72];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)auStack_78,&ptr->reference_tokens);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)(auStack_78 + 0x18),instance);
  std::__cxx11::string::string((string *)(auStack_78 + 0x28),(string *)message);
  peVar6 = (this->error_entry_list_).
           super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (peVar6 == (this->error_entry_list_).
                super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __first = (this->error_entry_list_).
              super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = (long)peVar6 - (long)__first;
    if (lVar2 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar3 = lVar2 / 0x48;
    __args_00 = (error_entry *)(lVar2 % 0x48);
    uVar4 = 1;
    if (peVar6 != __first) {
      uVar4 = uVar3;
    }
    uVar7 = uVar4 + uVar3;
    __alloc = (_Tp_alloc_type *)0x1c71c71c71c71c7;
    if (0x1c71c71c71c71c6 < uVar7) {
      uVar7 = 0x1c71c71c71c71c7;
    }
    if (CARRY8(uVar4,uVar3)) {
      uVar7 = 0x1c71c71c71c71c7;
    }
    if (uVar7 == 0) {
      __result = (pointer)0x0;
    }
    else {
      __result = (pointer)operator_new(uVar7 * 0x48);
      __args_00 = extraout_RDX;
    }
    std::
    allocator_traits<std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>>
    ::
    construct<(anonymous_namespace)::logical_combination_error_handler::error_entry,(anonymous_namespace)::logical_combination_error_handler::error_entry>
              ((allocator_type *)(__result + uVar3),(error_entry *)auStack_78,__args_00);
    peVar5 = std::
             vector<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
             ::_S_relocate(__first,peVar6,__result,__alloc);
    peVar6 = std::
             vector<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
             ::_S_relocate(peVar6,peVar6,peVar5 + 1,__alloc);
    lVar2 = (long)(this->error_entry_list_).
                  super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
    std::
    _Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
    ::_M_deallocate((_Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                     *)__first,(pointer)(lVar2 / 0x48),lVar2 % 0x48);
    (this->error_entry_list_).
    super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->error_entry_list_).
    super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = peVar6;
    (this->error_entry_list_).
    super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar7;
  }
  else {
    std::
    allocator_traits<std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>>
    ::
    construct<(anonymous_namespace)::logical_combination_error_handler::error_entry,(anonymous_namespace)::logical_combination_error_handler::error_entry>
              ((allocator_type *)peVar6,(error_entry *)auStack_78,__args);
    ppeVar1 = &(this->error_entry_list_).
               super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppeVar1 = *ppeVar1 + 1;
  }
  error_entry::~error_entry((error_entry *)auStack_78);
  return;
}

Assistant:

void error(const json::json_pointer &ptr, const json &instance, const std::string &message) override
	{
		error_entry_list_.push_back(error_entry{ptr, instance, message});
	}